

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O1

void ExpFmt(GmfMshSct *msh,int KwdCod)

{
  int *piVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  char *__s1;
  bool bVar5;
  int iVar6;
  long lVar7;
  size_t sVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  
  __s1 = GmfKwdFmt[KwdCod][2];
  if (*GmfKwdFmt[KwdCod][1] == '\0') {
    iVar6 = 1;
  }
  else {
    iVar6 = strcmp(__s1,"sr");
    if (iVar6 == 0) {
      iVar6 = 3;
    }
    else {
      iVar6 = strcmp(__s1,"hr");
      iVar6 = (iVar6 == 0) + 2;
    }
  }
  msh->KwdTab[KwdCod].typ = iVar6;
  iVar12 = 0;
  if ((iVar6 == 3) && (lVar7 = (long)msh->KwdTab[KwdCod].NmbTyp, iVar12 = 0, 0 < lVar7)) {
    lVar10 = 0;
    iVar12 = 0;
    do {
      switch(msh->KwdTab[KwdCod].TypTab[lVar10]) {
      case 1:
        iVar12 = iVar12 + 1;
        break;
      case 2:
        iVar12 = iVar12 + msh->dim;
        break;
      case 3:
        iVar6 = ((msh->dim + 1) * msh->dim) / 2;
        goto LAB_0010b036;
      case 4:
        iVar6 = msh->dim * msh->dim;
LAB_0010b036:
        iVar12 = iVar12 + iVar6;
      }
      lVar10 = lVar10 + 1;
    } while (lVar7 != lVar10);
  }
  msh->KwdTab[KwdCod].SolSiz = 0;
  msh->KwdTab[KwdCod].NmbWrd = 0;
  sVar8 = strlen(__s1);
  if (0 < (int)sVar8) {
    iVar6 = 0;
    do {
      cVar2 = __s1[iVar6];
      lVar7 = (long)iVar6 + 1;
      if ((cVar2 == 's') || (cVar2 == 'h')) {
        iVar6 = iVar6 + 2;
        if (0 < iVar12) {
          cVar2 = __s1[lVar7];
          iVar9 = iVar12;
          do {
            iVar3 = msh->KwdTab[KwdCod].SolSiz;
            msh->KwdTab[KwdCod].SolSiz = iVar3 + 1;
            msh->KwdTab[KwdCod].fmt[iVar3] = cVar2;
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
      }
      else if (cVar2 == 'd') {
        iVar6 = iVar6 + 2;
        if (0 < msh->dim) {
          cVar2 = __s1[lVar7];
          iVar9 = 0;
          do {
            iVar3 = msh->KwdTab[KwdCod].SolSiz;
            msh->KwdTab[KwdCod].SolSiz = iVar3 + 1;
            msh->KwdTab[KwdCod].fmt[iVar3] = cVar2;
            iVar9 = iVar9 + 1;
          } while (iVar9 < msh->dim);
        }
      }
      else {
        iVar6 = msh->KwdTab[KwdCod].SolSiz;
        msh->KwdTab[KwdCod].SolSiz = iVar6 + 1;
        msh->KwdTab[KwdCod].fmt[iVar6] = cVar2;
        iVar6 = (int)lVar7;
      }
      sVar8 = strlen(__s1);
    } while (iVar6 < (int)sVar8);
  }
  iVar6 = msh->FltSiz;
  iVar12 = msh->ver;
  lVar7 = (long)msh->KwdTab[KwdCod].SolSiz;
  if (0 < lVar7) {
    lVar10 = 0;
    do {
      cVar2 = msh->KwdTab[KwdCod].fmt[lVar10];
      iVar9 = (iVar6 != 0x20) + 1;
      if ((cVar2 == 'r') || (iVar9 = (3 < iVar12) + 1, cVar2 == 'i')) {
LAB_0010b142:
        piVar1 = &msh->KwdTab[KwdCod].NmbWrd;
        *piVar1 = *piVar1 + iVar9;
      }
      else if (cVar2 == 'c') {
        iVar9 = 0x40;
        goto LAB_0010b142;
      }
      lVar10 = lVar10 + 1;
    } while (lVar7 != lVar10);
  }
  iVar6 = strcmp(__s1,"hr");
  if ((iVar6 == 0) && (1 < msh->KwdTab[KwdCod].NmbNod)) {
    iVar6 = msh->KwdTab[KwdCod].NmbNod;
    if (0 < iVar6) {
      iVar12 = 1;
      do {
        uVar4 = msh->KwdTab[KwdCod].SolSiz;
        uVar11 = (ulong)uVar4;
        if (0 < (int)uVar4) {
          lVar7 = 0;
          do {
            msh->KwdTab[KwdCod].fmt[lVar7 + (int)uVar11 * iVar12] = msh->KwdTab[KwdCod].fmt[lVar7];
            lVar7 = lVar7 + 1;
            uVar11 = (ulong)msh->KwdTab[KwdCod].SolSiz;
          } while (lVar7 < (long)uVar11);
        }
        iVar6 = msh->KwdTab[KwdCod].NmbNod;
        bVar5 = iVar12 < iVar6;
        iVar12 = iVar12 + 1;
      } while (bVar5);
    }
    msh->KwdTab[KwdCod].SolSiz = msh->KwdTab[KwdCod].SolSiz * iVar6;
    msh->KwdTab[KwdCod].NmbWrd = iVar6 * msh->KwdTab[KwdCod].NmbWrd;
  }
  lVar7 = (long)msh->KwdTab[KwdCod].SolSiz;
  if (0 < lVar7) {
    lVar10 = 0;
    do {
      cVar2 = msh->KwdTab[KwdCod].fmt[lVar10];
      if (cVar2 == 'r') {
        piVar1 = &msh->KwdTab[KwdCod].NmbDbl;
        *piVar1 = *piVar1 + 1;
      }
      else if (cVar2 == 'i') {
        piVar1 = &msh->KwdTab[KwdCod].NmbInt;
        *piVar1 = *piVar1 + 1;
      }
      lVar10 = lVar10 + 1;
    } while (lVar7 != lVar10);
  }
  return;
}

Assistant:

static void ExpFmt(GmfMshSct *msh, int KwdCod)
{
   int         i, j, TmpSiz=0, IntWrd, FltWrd;
   char        chr;
   const char  *InpFmt = GmfKwdFmt[ KwdCod ][2];
   KwdSct      *kwd = &msh->KwdTab[ KwdCod ];

   // Set the kwd's type
   if(!strlen(GmfKwdFmt[ KwdCod ][1]))
      kwd->typ = InfKwd;
   else if( !strcmp(InpFmt, "sr") || !strcmp(InpFmt, "hr") )
      kwd->typ = SolKwd;
   else
      kwd->typ = RegKwd;

   // Get the solution-field's size
   if(kwd->typ == SolKwd)
      for(i=0;i<kwd->NmbTyp;i++)
         switch(kwd->TypTab[i])
         {
            case GmfSca    : TmpSiz += 1; break;
            case GmfVec    : TmpSiz += msh->dim; break;
            case GmfSymMat : TmpSiz += (msh->dim * (msh->dim+1)) / 2; break;
            case GmfMat    : TmpSiz += msh->dim * msh->dim; break;
         }

   // Scan each character from the format string
   i = kwd->SolSiz = kwd->NmbWrd = 0;

   while(i < (int)strlen(InpFmt))
   {
      chr = InpFmt[ i++ ];

      if(chr == 'd')
      {
         chr = InpFmt[i++];

         for(j=0;j<msh->dim;j++)
            kwd->fmt[ kwd->SolSiz++ ] = chr;
      }
      else if((chr == 's')||(chr == 'h'))
      {
         chr = InpFmt[i++];

         for(j=0;j<TmpSiz;j++)
            kwd->fmt[ kwd->SolSiz++ ] = chr;
      }
      else
         kwd->fmt[ kwd->SolSiz++ ] = chr;
   }

   if(msh->FltSiz == 32)
      FltWrd = 1;
   else
      FltWrd = 2;

   if(msh->ver <= 3)
      IntWrd = 1;
   else
      IntWrd = 2;

   for(i=0;i<kwd->SolSiz;i++)
      switch(kwd->fmt[i])
      {
         case 'i' : kwd->NmbWrd += IntWrd; break;
         case 'c' : kwd->NmbWrd += FilStrSiz; break;
         case 'r' : kwd->NmbWrd += FltWrd;break;
      }

   // HO solution: duplicate the format as many times as the number of nodes
   if( !strcmp(InpFmt, "hr") && (kwd->NmbNod > 1) )
   {
      for(i=1;i<=kwd->NmbNod;i++)
         for(j=0;j<kwd->SolSiz;j++)
            kwd->fmt[ i * kwd->SolSiz + j ] = kwd->fmt[j];

      kwd->SolSiz *= kwd->NmbNod;
      kwd->NmbWrd *= kwd->NmbNod;
   }

   // Count the final number of intergers and reals needed by the Fortran API
   for(i=0;i<kwd->SolSiz;i++)
      if(kwd->fmt[i] == 'i')
         kwd->NmbInt++;
      else if(kwd->fmt[i] == 'r')
         kwd->NmbDbl++;
}